

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O1

void blend_tiled_argb(int count,QT_FT_Span *spans,void *userData)

{
  char cVar1;
  int iVar2;
  QThreadPool *pQVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  long in_FS_OFFSET;
  QSemaphore semaphore;
  anon_class_48_8_3fbc74da function;
  Operator op;
  undefined1 *local_120;
  QT_FT_Span *local_118;
  int iStack_110;
  uint uStack_10c;
  int local_108;
  uint uStack_104;
  int iStack_100;
  undefined4 uStack_fc;
  long *local_f8;
  CompositionFunction p_Stack_f0;
  Operator local_e8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(uint *)((long)userData + 0xd0) | 2) != 6) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      blend_tiled_generic(count,spans,userData);
      return;
    }
    goto LAB_006661f9;
  }
  memcpy(&local_e8,&DAT_006dea50,0xb0);
  getOperator(&local_e8,(QSpanData *)userData,spans,count);
  iVar11 = *(int *)((long)userData + 0xb0);
  iVar12 = *(int *)((long)userData + 0xb4);
  iVar6 = (int)((double)((ulong)-*(double *)((long)userData + 0x70) & 0x8000000000000000 |
                        0x3fe0000000000000) - *(double *)((long)userData + 0x70)) % iVar11;
  iVar8 = (int)((double)((ulong)-*(double *)((long)userData + 0x78) & 0x8000000000000000 |
                        0x3fe0000000000000) - *(double *)((long)userData + 0x78)) % iVar12;
  iVar7 = 0;
  if (0 < iVar6) {
    iVar7 = iVar11;
  }
  iVar2 = 0;
  if (0 < iVar8) {
    iVar2 = iVar12;
  }
  _iStack_110 = CONCAT44(iVar11,iVar7 - iVar6);
  _local_108 = CONCAT44(iVar12,iVar2 - iVar8);
  _iStack_100 = CONCAT44(0xaaaaaaaa,*(undefined4 *)((long)userData + 0xe8));
  p_Stack_f0 = local_e8.func;
  iVar11 = count + 0x5f;
  if (-1 < count + 0x20) {
    iVar11 = count + 0x20;
  }
  local_118 = spans;
  local_f8 = (long *)userData;
  pQVar3 = QGuiApplicationPrivate::qtGuiThreadPool();
  if (((count < 0x60) || (pQVar3 == (QThreadPool *)0x0)) ||
     ((int)qPixelLayouts[*(uint *)(*userData + 0x10)].bpp < 3)) {
LAB_00665f9d:
    if (0 < count) {
      uVar10 = 0;
      do {
        iVar11 = local_118[uVar10].len;
        if (iVar11 != 0) {
          iVar7 = (uint)local_118[uVar10].coverage * iStack_100;
          iVar12 = local_118[uVar10].x;
          iVar6 = (local_118[uVar10].y + local_108) % (int)uStack_104;
          uVar9 = iVar6 >> 0x1f & uStack_104;
          iVar8 = (iStack_110 + iVar12) % (int)uStack_10c;
          iVar8 = (iVar8 >> 0x1f & uStack_10c) + iVar8;
          do {
            iVar2 = uStack_10c - iVar8;
            if (iVar11 <= (int)(uStack_10c - iVar8)) {
              iVar2 = iVar11;
            }
            if (0x7ff < iVar2) {
              iVar2 = 0x800;
            }
            (*p_Stack_f0)((uint *)((long)local_118[uVar10].y * *(long *)(*local_f8 + 0x28) +
                                   *(long *)(*local_f8 + 0x38) + (long)iVar12 * 4),
                          (uint *)(local_f8[0x19] * (long)(int)(uVar9 + iVar6) + local_f8[0x15] +
                                  (long)iVar8 * 4),iVar2,iVar7 >> 8);
            iVar12 = iVar12 + iVar2;
            iVar8 = iVar8 + iVar2;
            if ((int)uStack_10c <= iVar8) {
              iVar8 = 0;
            }
            iVar11 = iVar11 - iVar2;
          } while (iVar11 != 0);
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != (uint)count);
    }
  }
  else {
    QThread::currentThread();
    cVar1 = QThreadPool::contains((QThread *)pQVar3);
    if (cVar1 != '\0') goto LAB_00665f9d;
    iVar11 = iVar11 >> 6;
    local_120 = &DAT_aaaaaaaaaaaaaaaa;
    iVar7 = 0;
    QSemaphore::QSemaphore((QSemaphore *)&local_120,0);
    iVar12 = 1;
    if (1 < iVar11) {
      iVar12 = iVar11;
    }
    iVar6 = 0;
    do {
      iVar8 = (count - iVar6) / (iVar11 + iVar7);
      puVar4 = (undefined8 *)operator_new(0x18);
      *(undefined1 *)(puVar4 + 1) = 1;
      *puVar4 = QFactoryLoader::keyMap;
      puVar5 = (undefined8 *)operator_new(0x20);
      *puVar5 = QRunnable::QGenericRunnable::
                Helper<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/painting/qdrawhelper.cpp:4952:5)>
                ::impl;
      *(int *)(puVar5 + 1) = iVar6;
      *(int *)((long)puVar5 + 0xc) = iVar8;
      puVar5[2] = &local_118;
      puVar5[3] = &local_120;
      puVar4[2] = puVar5;
      QThreadPool::start((QRunnable *)pQVar3,(int)puVar4);
      iVar6 = iVar6 + iVar8;
      iVar7 = iVar7 + -1;
    } while (-iVar12 != iVar7);
    QSemaphore::acquire((int)(QSemaphore *)&local_120);
    QSemaphore::~QSemaphore((QSemaphore *)&local_120);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_006661f9:
  __stack_chk_fail();
}

Assistant:

static void blend_tiled_argb(int count, const QT_FT_Span *spans, void *userData)
{
    QSpanData *data = reinterpret_cast<QSpanData *>(userData);
    if (data->texture.format != QImage::Format_ARGB32_Premultiplied
        && data->texture.format != QImage::Format_RGB32) {
        blend_tiled_generic(count, spans, userData);
        return;
    }

    const Operator op = getOperator(data, spans, count);

    const int image_width = data->texture.width;
    const int image_height = data->texture.height;
    int xoff = -qRound(-data->dx) % image_width;
    int yoff = -qRound(-data->dy) % image_height;

    if (xoff < 0)
        xoff += image_width;
    if (yoff < 0)
        yoff += image_height;
    const auto func = op.func;
    const int const_alpha = data->texture.const_alpha;

    auto function = [=] (int cStart, int cEnd) {
        for (int c = cStart; c < cEnd; ++c) {
            int x = spans[c].x;
            int length = spans[c].len;
            int sx = (xoff + spans[c].x) % image_width;
            int sy = (spans[c].y + yoff) % image_height;
            if (sx < 0)
                sx += image_width;
            if (sy < 0)
                sy += image_height;

            const int coverage = (spans[c].coverage * const_alpha) >> 8;
            while (length) {
                int l = qMin(image_width - sx, length);
                if (BufferSize < l)
                    l = BufferSize;
                const uint *src = (const uint *)data->texture.scanLine(sy) + sx;
                uint *dest = ((uint *)data->rasterBuffer->scanLine(spans[c].y)) + x;
                func(dest, src, l, coverage);
                x += l;
                sx += l;
                length -= l;
                if (sx >= image_width)
                    sx = 0;
            }
        }
    };
    QT_THREAD_PARALLEL_FILLS(function);
}